

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O2

bool __thiscall
slang::ast::SpecifyBlockSymbol::checkPathTerminal
          (SpecifyBlockSymbol *this,ValueSymbol *terminal,Type *type,Scope *specifyParent,
          SpecifyTerminalDir dir,SourceRange sourceRange)

{
  SymbolKind SVar1;
  int iVar2;
  Symbol *pSVar3;
  SourceLocation SVar4;
  bool bVar5;
  Diagnostic *pDVar6;
  SpecifyTerminalDir SVar7;
  string_view *psVar8;
  undefined4 in_register_00000084;
  SourceLocation in_R9;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  anon_class_32_4_2c8b6779 reportErr;
  SpecifyTerminalDir local_64;
  anon_class_32_4_2c8b6779 local_60;
  SourceRange local_40;
  
  SVar4._4_4_ = in_register_00000084;
  SVar4._0_4_ = dir;
  SVar7 = (SpecifyTerminalDir)specifyParent;
  local_40.startLoc._4_4_ = in_register_00000084;
  local_40.startLoc._0_4_ = dir;
  local_64 = SVar7;
  bVar5 = Type::isIntegral((Type *)terminal);
  if (bVar5) {
    local_60.dir = &local_64;
    local_60.sourceRange = &local_40;
    SVar1 = (this->super_Symbol).kind;
    local_60.specifyParent = (Scope *)type;
    local_60.terminal = (ValueSymbol *)this;
    if (SVar1 == ModportPort) {
      iVar2 = *(int *)&this[2].super_Scope.lastMember;
      if (iVar2 == 2) {
        return true;
      }
      if ((iVar2 == 0 || SVar7 != Input) && (iVar2 == 1 || SVar7 != Output)) {
        return true;
      }
    }
    else if ((SVar1 == Net) || (SVar1 == Variable && SVar7 != Input)) {
      pSVar3 = ((this->super_Symbol).parentScope)->thisSym;
      if ((pSVar3->kind == InstanceBody) && (*(int *)(pSVar3[2].name._M_str + 0x48) == 1)) {
        return true;
      }
      if (pSVar3 != (Symbol *)(type->super_Symbol).name._M_len) {
        sourceRange_00.endLoc = in_R9;
        sourceRange_00.startLoc = SVar4;
        Scope::addDiag((Scope *)type,(DiagCode)0x640006,sourceRange_00);
        return false;
      }
      if (SVar7 == Both) {
        return true;
      }
      psVar8 = (string_view *)&this[2].super_Scope.firstMember;
      while (pSVar3 = (Symbol *)psVar8->_M_len, pSVar3 != (Symbol *)0x0) {
        iVar2 = *(int *)(*(long *)pSVar3 + 0x50);
        if (iVar2 == 2) {
          return true;
        }
        if (iVar2 == 0 && SVar7 == Input) {
          return true;
        }
        psVar8 = &pSVar3->name;
        if (iVar2 == 1 && SVar7 == Output) {
          return true;
        }
      }
    }
    checkPathTerminal::anon_class_32_4_2c8b6779::operator()(&local_60);
  }
  else {
    bVar5 = Type::isError((Type *)terminal);
    if (!bVar5) {
      sourceRange_01.endLoc = in_R9;
      sourceRange_01.startLoc = SVar4;
      pDVar6 = Scope::addDiag((Scope *)type,(DiagCode)0x660006,sourceRange_01);
      pDVar6 = Diagnostic::operator<<(pDVar6,(this->super_Symbol).name);
      ast::operator<<(pDVar6,(Type *)terminal);
    }
  }
  return false;
}

Assistant:

bool SpecifyBlockSymbol::checkPathTerminal(const ValueSymbol& terminal, const Type& type,
                                           const Scope& specifyParent, SpecifyTerminalDir dir,
                                           SourceRange sourceRange) {
    // Type must be integral.
    if (!type.isIntegral()) {
        if (!type.isError())
            specifyParent.addDiag(diag::InvalidSpecifyType, sourceRange) << terminal.name << type;
        return false;
    }

    auto reportErr = [&] {
        auto code = dir == SpecifyTerminalDir::Input ? diag::InvalidSpecifySource
                                                     : diag::InvalidSpecifyDest;
        auto& diag = specifyParent.addDiag(code, sourceRange) << terminal.name;
        diag.addNote(diag::NoteDeclarationHere, terminal.location);
    };

    // Inputs must be nets (or modport ports) and outputs must
    // be nets or variables (or modport ports).
    if (terminal.kind != SymbolKind::Net && terminal.kind != SymbolKind::ModportPort &&
        (terminal.kind != SymbolKind::Variable || dir == SpecifyTerminalDir::Input)) {
        reportErr();
        return false;
    }

    if (terminal.kind == SymbolKind::ModportPort) {
        // Check that the modport port has the correct direction.
        auto portDir = terminal.as<ModportPortSymbol>().direction;
        if (portDir != ArgumentDirection::InOut &&
            ((dir == SpecifyTerminalDir::Input && portDir != ArgumentDirection::In) ||
             (dir == SpecifyTerminalDir::Output && portDir != ArgumentDirection::Out))) {
            reportErr();
            return false;
        }
        return true;
    }

    auto terminalParentScope = terminal.getParentScope();
    SLANG_ASSERT(terminalParentScope);

    auto& terminalParent = terminalParentScope->asSymbol();
    if (terminalParent.kind == SymbolKind::InstanceBody &&
        terminalParent.as<InstanceBodySymbol>().getDefinition().definitionKind ==
            DefinitionKind::Interface) {
        // If the signal is part of an interface then the only way we could have accessed
        // it is through an interface port, in which case the direction is "inout" and
        // therefore fine no matter whether this is an input or output terminal.
        return true;
    }

    // If we get here then the terminal must be a member of the module containing
    // our parent specify block.
    if (&terminalParent != &specifyParent.asSymbol()) {
        specifyParent.addDiag(diag::InvalidSpecifyPath, sourceRange);
        return false;
    }

    if (dir == SpecifyTerminalDir::Both)
        return true;

    // Check that the terminal is connected to a module port and that
    // the direction is correct.
    for (auto portRef = terminal.getFirstPortBackref(); portRef;
         portRef = portRef->getNextBackreference()) {
        auto portDir = portRef->port->direction;
        if (portDir == ArgumentDirection::InOut ||
            (dir == SpecifyTerminalDir::Input && portDir == ArgumentDirection::In) ||
            (dir == SpecifyTerminalDir::Output && portDir == ArgumentDirection::Out)) {
            return true;
        }
    }

    reportErr();
    return false;
}